

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockExpectedCallTest.cpp
# Opt level: O0

void __thiscall
TEST_MockExpectedCall_callWithTwoUnsignedIntegerParameter_Test::
~TEST_MockExpectedCall_callWithTwoUnsignedIntegerParameter_Test
          (TEST_MockExpectedCall_callWithTwoUnsignedIntegerParameter_Test *this)

{
  TEST_MockExpectedCall_callWithTwoUnsignedIntegerParameter_Test *this_local;
  
  ~TEST_MockExpectedCall_callWithTwoUnsignedIntegerParameter_Test(this);
  operator_delete(this,0x18);
  return;
}

Assistant:

TEST(MockExpectedCall, callWithTwoUnsignedIntegerParameter)
{
    unsigned int expected_value = 1;
    unsigned int another_expected_value = 2;

    call->withParameter("unsigned-integer1", expected_value);
    call->withParameter("unsigned-integer2", another_expected_value);
    STRCMP_EQUAL("unsigned int", call->getInputParameterType("unsigned-integer1").asCharString());
    STRCMP_EQUAL("unsigned int", call->getInputParameterType("unsigned-integer2").asCharString());
    LONGS_EQUAL(expected_value, call->getInputParameter("unsigned-integer1").getUnsignedIntValue());
    LONGS_EQUAL(another_expected_value, call->getInputParameter("unsigned-integer2").getUnsignedIntValue());
}